

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usprep.cpp
# Opt level: O2

void usprep_close_63(UStringPrepProfile *profile)

{
  if (profile != (UStringPrepProfile *)0x0) {
    umtx_lock_63(&usprepMutex);
    if (0 < profile->refCount) {
      profile->refCount = profile->refCount + -1;
    }
    umtx_unlock_63(&usprepMutex);
    return;
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
usprep_close(UStringPrepProfile* profile){
    if(profile==NULL){
        return;
    }

    umtx_lock(&usprepMutex);
    /* decrement the ref count*/
    if(profile->refCount > 0){
        profile->refCount--;
    }
    umtx_unlock(&usprepMutex);
    
}